

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_support.c
# Opt level: O0

int uper_put_nsnnwn(asn_per_outp_t *po,int n)

{
  int iVar1;
  int in_ESI;
  int bytes;
  int in_stack_00000020;
  uint32_t in_stack_00000024;
  asn_per_outp_t *in_stack_00000028;
  int local_4;
  
  if (in_ESI < 0x40) {
    if (in_ESI < 0) {
      local_4 = -1;
    }
    else {
      local_4 = per_put_few_bits(in_stack_00000028,in_stack_00000024,in_stack_00000020);
    }
  }
  else if (((in_ESI < 0x100) || (in_ESI < 0x10000)) || (in_ESI < 0x1000000)) {
    iVar1 = per_put_few_bits(in_stack_00000028,in_stack_00000024,in_stack_00000020);
    if (iVar1 == 0) {
      local_4 = per_put_few_bits(in_stack_00000028,in_stack_00000024,in_stack_00000020);
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int
uper_put_nsnnwn(asn_per_outp_t *po, int n) {
	int bytes;

	if(n <= 63) {
		if(n < 0) return -1;
		return per_put_few_bits(po, n, 7);
	}
	if(n < 256)
		bytes = 1;
	else if(n < 65536)
		bytes = 2;
	else if(n < 256 * 65536)
		bytes = 3;
	else
		return -1;	/* This is not a "normally small" value */
	if(per_put_few_bits(po, bytes, 8))
		return -1;

	return per_put_few_bits(po, n, 8 * bytes);
}